

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void update_map(Integer **top,Integer **list,Integer **idx,Integer **jdx,void **data,Integer idim,
               Integer jdim,Integer elemsize,Integer *bufsize,Integer *ncnt)

{
  long lVar1;
  long lVar2;
  Integer *__ptr;
  Integer *pIVar3;
  Integer *pIVar4;
  void *pvVar5;
  Integer *pIVar6;
  long lVar7;
  long lVar8;
  Integer *pIVar9;
  Integer *__s;
  void *pvVar10;
  Integer *pIVar11;
  Integer *pIVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  size_t __size;
  void *__dest;
  long lVar16;
  
  lVar2 = *bufsize;
  lVar1 = lVar2 * 2;
  __size = lVar2 << 4;
  pIVar9 = (Integer *)malloc(__size);
  __s = (Integer *)malloc(__size);
  pvVar10 = malloc(lVar1 * elemsize);
  if (0 < lVar2) {
    memset(__s,0xff,__size);
  }
  pIVar11 = (Integer *)malloc(__size);
  pIVar12 = (Integer *)malloc(__size);
  __ptr = *top;
  if (lVar2 < 1) {
    lVar15 = 0;
  }
  else {
    lVar15 = 0;
    lVar13 = 0;
    do {
      lVar16 = __ptr[lVar13];
      if (-1 < lVar16) {
        pIVar3 = *idx;
        pIVar4 = *jdx;
        pvVar5 = *data;
        pIVar6 = *list;
        __dest = (void *)(elemsize * lVar15 + (long)pvVar10);
        do {
          lVar7 = pIVar3[lVar16];
          lVar8 = pIVar4[lVar16];
          lVar14 = (lVar7 * jdim + lVar8) % lVar1;
          __s[lVar15] = pIVar9[lVar14];
          pIVar9[lVar14] = lVar15;
          pIVar11[lVar15] = lVar7;
          pIVar12[lVar15] = lVar8;
          memcpy(__dest,(void *)(lVar16 * elemsize + (long)pvVar5),elemsize);
          lVar15 = lVar15 + 1;
          lVar16 = pIVar6[lVar16];
          __dest = (void *)((long)__dest + elemsize);
        } while (-1 < lVar16);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar2);
  }
  free(__ptr);
  free(*list);
  free(*idx);
  free(*jdx);
  free(*data);
  *bufsize = lVar1;
  *top = pIVar9;
  *list = __s;
  *idx = pIVar11;
  *jdx = pIVar12;
  *data = pvVar10;
  *ncnt = lVar15;
  return;
}

Assistant:

void update_map(Integer **top, Integer **list, Integer **idx, Integer **jdx,
    void **data, Integer idim, Integer jdim, Integer elemsize,
    Integer *bufsize, Integer *ncnt)
{
  Integer *ttop;
  Integer *tlist;
  Integer *tidx, *tjdx;
  Integer lcnt;
  Integer newsize;
  void *tdata;
  char *nptr;
  char *optr;
  Integer ii,jj;
  newsize = 2*(*bufsize);
  ttop = (Integer*)malloc(newsize*sizeof(Integer));
  tlist = (Integer*)malloc(newsize*sizeof(Integer));
  tdata = malloc(newsize*elemsize);
  lcnt = 0;
  for (ii=0; ii<newsize; ii++) tlist[ii] = -1;
  tidx = (Integer*)malloc(newsize*sizeof(Integer));
  tjdx = (Integer*)malloc(newsize*sizeof(Integer));
  for (ii=0; ii<*bufsize; ii++) {
    jj = (*top)[ii];
    while (jj >= 0) {
      Integer itmp = (*idx)[jj];
      Integer jtmp = (*jdx)[jj];
      Integer index = (jdim*itmp + jtmp)%newsize;
      tlist[lcnt] = ttop[index];
      ttop[index] = lcnt;
      tidx[lcnt] = itmp; 
      tjdx[lcnt] = jtmp; 
      nptr = (char*)tdata + lcnt*elemsize;
      optr = (char*)(*data) + jj*elemsize;
      memcpy(nptr,optr,elemsize);
      jj = (*list)[jj];
      lcnt++;
    }
  }
  free(*top);
  free(*list);
  free(*idx);
  free(*jdx);
  free(*data);
  *bufsize = newsize;
  *top = ttop;
  *list = tlist;
  *idx = tidx;
  *jdx = tjdx;
  *data = tdata;
  *ncnt = lcnt;
}